

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doJSONAttachments(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  reference val;
  element_type *peVar2;
  reference val_00;
  reference __in;
  type *val_01;
  allocator<char> local_6c1;
  string local_6c0;
  string local_6a0;
  string local_680;
  JSON local_660;
  allocator<char> local_649;
  JSON local_648 [2];
  JSON local_628;
  string local_618;
  JSON local_5f8;
  allocator<char> local_5e1;
  JSON local_5e0 [2];
  JSON local_5c0;
  string local_5b0;
  string local_590;
  JSON local_570;
  allocator<char> local_559;
  JSON local_558 [2];
  JSON local_538;
  string local_528;
  string local_508;
  JSON local_4e8;
  allocator<char> local_4d1;
  JSON local_4d0 [2];
  JSON local_4b0;
  JSON local_4a0;
  undefined1 local_490 [8];
  JSON j_stream;
  undefined1 local_470 [8];
  QPDFEFStreamObjectHelper efs;
  type *value2;
  type *key2;
  _Self local_420;
  iterator __end2_1;
  iterator __begin2_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_400;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  Dictionary *__range2_1;
  allocator<char> local_3d1;
  JSON local_3d0 [2];
  undefined1 local_3b0 [8];
  JSON j_streams;
  JSON local_390;
  reference local_380;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i2;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  allocator<char> local_319;
  JSON local_318 [2];
  undefined1 local_2f8 [8];
  JSON j_names;
  JSON local_2c8;
  allocator<char> local_2b1;
  JSON local_2b0 [2];
  JSON local_290;
  allocator<char> local_279;
  string local_278 [32];
  undefined1 local_258 [16];
  string local_248;
  JSON local_228;
  allocator<char> local_211;
  JSON local_210 [2];
  JSON local_1f0;
  string local_1e0;
  JSON local_1c0;
  allocator<char> local_1a9;
  JSON local_1a8 [2];
  JSON local_188;
  undefined1 local_178 [16];
  string local_168;
  JSON local_148;
  allocator<char> local_131;
  JSON local_130 [2];
  JSON local_110;
  JSON local_100;
  undefined1 local_f0 [8];
  JSON j_details;
  shared_ptr<QPDFFileSpecObjectHelper> fsoh;
  string *key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>
  *iter;
  _Self local_b8;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
  *__range1;
  undefined1 local_60 [8];
  QPDFEmbeddedFileDocumentHelper efdh;
  JSON j_attachments;
  anon_class_1_0_00000001 null_or_string;
  anon_class_1_0_00000001 to_iso8601;
  QPDF *pdf_local;
  bool *first_local;
  Pipeline *p_local;
  QPDFJob *this_local;
  
  JSON::makeDictionary();
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)local_60,pdf);
  QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
              *)&__begin1,(QPDFEmbeddedFileDocumentHelper *)local_60);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
                    *)&__begin1);
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
              *)&__begin1);
  while (bVar1 = std::operator!=(&__end1,&local_b8), bVar1) {
    val = std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>
          ::operator*(&__end1);
    std::shared_ptr<QPDFFileSpecObjectHelper>::shared_ptr
              ((shared_ptr<QPDFFileSpecObjectHelper> *)
               &j_details.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&val->second);
    JSON::makeDictionary();
    JSON::addDictionaryMember
              ((JSON *)local_f0,
               (string *)
               &efdh.m.
                super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(JSON *)val);
    JSON::~JSON(&local_100);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_130,"filespec",&local_131);
    std::__shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&j_details.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
    QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_178);
    QPDFObjectHandle::unparse_abi_cxx11_((string *)(local_178 + 0x10),(QPDFObjectHandle *)local_178)
    ;
    JSON::makeString(&local_148,(string *)(local_178 + 0x10));
    JSON::addDictionaryMember(&local_110,(string *)local_f0,local_130);
    JSON::~JSON(&local_110);
    JSON::~JSON(&local_148);
    std::__cxx11::string::~string((string *)(local_178 + 0x10));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_178);
    std::__cxx11::string::~string((string *)local_130);
    std::allocator<char>::~allocator(&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"preferredname",&local_1a9);
    peVar2 = std::
             __shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&j_details.m.
                              super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    QPDFFileSpecObjectHelper::getFilename_abi_cxx11_(&local_1e0,peVar2);
    JSON::makeString(&local_1c0,&local_1e0);
    JSON::addDictionaryMember(&local_188,(string *)local_f0,local_1a8);
    JSON::~JSON(&local_188);
    JSON::~JSON(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"preferredcontents",&local_211);
    peVar2 = std::
             __shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&j_details.m.
                              super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_278,"",&local_279);
    QPDFFileSpecObjectHelper::getEmbeddedFileStream
              ((QPDFFileSpecObjectHelper *)local_258,(string *)peVar2);
    QPDFObjectHandle::unparse_abi_cxx11_((string *)(local_258 + 0x10),(QPDFObjectHandle *)local_258)
    ;
    JSON::makeString(&local_228,(string *)(local_258 + 0x10));
    JSON::addDictionaryMember(&local_1f0,(string *)local_f0,local_210);
    JSON::~JSON(&local_1f0);
    JSON::~JSON(&local_228);
    std::__cxx11::string::~string((string *)(local_258 + 0x10));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_258);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)local_210);
    std::allocator<char>::~allocator(&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2b0,"description",&local_2b1)
    ;
    peVar2 = std::
             __shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&j_details.m.
                              super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    QPDFFileSpecObjectHelper::getDescription_abi_cxx11_
              ((string *)
               &j_names.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               peVar2);
    doJSONAttachments::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&local_2c8,
               (string *)
               ((long)&j_attachments.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 6));
    JSON::addDictionaryMember(&local_290,(string *)local_f0,local_2b0);
    JSON::~JSON(&local_290);
    JSON::~JSON(&local_2c8);
    std::__cxx11::string::~string
              ((string *)
               &j_names.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__cxx11::string::~string((string *)local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"names",&local_319);
    JSON::makeDictionary();
    JSON::addDictionaryMember((JSON *)local_2f8,(string *)local_f0,local_318);
    JSON::~JSON((JSON *)&__range2);
    std::__cxx11::string::~string((string *)local_318);
    std::allocator<char>::~allocator(&local_319);
    peVar2 = std::
             __shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&j_details.m.
                              super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    QPDFFileSpecObjectHelper::getFilenames_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&__begin2,peVar2);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&__begin2);
    i2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__begin2);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&i2), bVar1) {
      val_00 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end2);
      local_380 = val_00;
      JSON::makeString((JSON *)&j_streams.m.
                                super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,&val_00->second);
      JSON::addDictionaryMember(&local_390,(string *)local_2f8,(JSON *)val_00);
      JSON::~JSON(&local_390);
      JSON::~JSON((JSON *)&j_streams.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&__begin2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3d0,"streams",&local_3d1);
    JSON::makeDictionary();
    JSON::addDictionaryMember((JSON *)local_3b0,(string *)local_f0,local_3d0);
    JSON::~JSON((JSON *)&__range2_1);
    std::__cxx11::string::~string((string *)local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    std::__shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&j_details.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
    QPDFFileSpecObjectHelper::getEmbeddedFileStreams((QPDFFileSpecObjectHelper *)&__begin2_1);
    QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&local_400,(typed)&__begin2_1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__begin2_1);
    local_3f0._M_pi = &local_400;
    __end2_1 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)local_3f0._M_pi);
    local_420._M_node =
         (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)local_3f0._M_pi);
    while (bVar1 = std::operator!=(&__end2_1,&local_420), bVar1) {
      __in = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
             ::operator*(&__end2_1);
      val_01 = std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>(__in);
      efs.m.super___shared_ptr<QPDFEFStreamObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>(__in);
      bVar1 = ::qpdf::BaseHandle::null
                        ((BaseHandle *)
                         efs.m.
                         super___shared_ptr<QPDFEFStreamObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
      if (!bVar1) {
        this_00 = &j_stream.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)this_00,
                   (QPDFObjectHandle *)
                   efs.m.
                   super___shared_ptr<QPDFEFStreamObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        QPDFEFStreamObjectHelper::QPDFEFStreamObjectHelper
                  ((QPDFEFStreamObjectHelper *)local_470,(QPDFObjectHandle *)this_00);
        QPDFObjectHandle::~QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &j_stream.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        JSON::makeDictionary();
        JSON::addDictionaryMember((JSON *)local_490,(string *)local_3b0,(JSON *)val_01);
        JSON::~JSON(&local_4a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_4d0,"creationdate",&local_4d1);
        QPDFEFStreamObjectHelper::getCreationDate_abi_cxx11_
                  (&local_528,(QPDFEFStreamObjectHelper *)local_470);
        doJSONAttachments::anon_class_1_0_00000001::operator()
                  (&local_508,
                   (anon_class_1_0_00000001 *)
                   ((long)&j_attachments.m.
                           super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi + 7),&local_528);
        doJSONAttachments::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&local_4e8,
                   (string *)
                   ((long)&j_attachments.m.
                           super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi + 6));
        JSON::addDictionaryMember(&local_4b0,(string *)local_490,local_4d0);
        JSON::~JSON(&local_4b0);
        JSON::~JSON(&local_4e8);
        std::__cxx11::string::~string((string *)&local_508);
        std::__cxx11::string::~string((string *)&local_528);
        std::__cxx11::string::~string((string *)local_4d0);
        std::allocator<char>::~allocator(&local_4d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_558,"modificationdate",&local_559);
        QPDFEFStreamObjectHelper::getCreationDate_abi_cxx11_
                  (&local_5b0,(QPDFEFStreamObjectHelper *)local_470);
        doJSONAttachments::anon_class_1_0_00000001::operator()
                  (&local_590,
                   (anon_class_1_0_00000001 *)
                   ((long)&j_attachments.m.
                           super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi + 7),&local_5b0);
        doJSONAttachments::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&local_570,
                   (string *)
                   ((long)&j_attachments.m.
                           super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi + 6));
        JSON::addDictionaryMember(&local_538,(string *)local_490,local_558);
        JSON::~JSON(&local_538);
        JSON::~JSON(&local_570);
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)local_558);
        std::allocator<char>::~allocator(&local_559);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_5e0,"mimetype",&local_5e1);
        QPDFEFStreamObjectHelper::getSubtype_abi_cxx11_
                  (&local_618,(QPDFEFStreamObjectHelper *)local_470);
        doJSONAttachments::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&local_5f8,
                   (string *)
                   ((long)&j_attachments.m.
                           super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi + 6));
        JSON::addDictionaryMember(&local_5c0,(string *)local_490,local_5e0);
        JSON::~JSON(&local_5c0);
        JSON::~JSON(&local_5f8);
        std::__cxx11::string::~string((string *)&local_618);
        std::__cxx11::string::~string((string *)local_5e0);
        std::allocator<char>::~allocator(&local_5e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_648,"checksum",&local_649);
        QPDFEFStreamObjectHelper::getChecksum_abi_cxx11_
                  (&local_6a0,(QPDFEFStreamObjectHelper *)local_470);
        QUtil::hex_encode(&local_680,&local_6a0);
        doJSONAttachments::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&local_660,
                   (string *)
                   ((long)&j_attachments.m.
                           super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi + 6));
        JSON::addDictionaryMember(&local_628,(string *)local_490,local_648);
        JSON::~JSON(&local_628);
        JSON::~JSON(&local_660);
        std::__cxx11::string::~string((string *)&local_680);
        std::__cxx11::string::~string((string *)&local_6a0);
        std::__cxx11::string::~string((string *)local_648);
        std::allocator<char>::~allocator(&local_649);
        JSON::~JSON((JSON *)local_490);
        QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper((QPDFEFStreamObjectHelper *)local_470);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end2_1);
    }
    ::qpdf::Dictionary::~Dictionary((Dictionary *)&local_400);
    JSON::~JSON((JSON *)local_3b0);
    JSON::~JSON((JSON *)local_2f8);
    JSON::~JSON((JSON *)local_f0);
    std::shared_ptr<QPDFFileSpecObjectHelper>::~shared_ptr
              ((shared_ptr<QPDFFileSpecObjectHelper> *)
               &j_details.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
          *)&__begin1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,"attachments",&local_6c1);
  JSON::writeDictionaryItem
            (p,first,&local_6c0,
             (JSON *)&efdh.m.
                      super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,1);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)local_60);
  JSON::~JSON((JSON *)&efdh.m.
                       super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  return;
}

Assistant:

void
QPDFJob::doJSONAttachments(Pipeline* p, bool& first, QPDF& pdf)
{
    auto to_iso8601 = [](std::string const& d) {
        // Convert PDF date to iso8601 if not empty; if empty, return
        // empty.
        std::string iso8601;
        QUtil::pdf_time_to_iso8601(d, iso8601);
        return iso8601;
    };

    auto null_or_string = [](std::string const& s) {
        if (s.empty()) {
            return JSON::makeNull();
        } else {
            return JSON::makeString(s);
        }
    };

    JSON j_attachments = JSON::makeDictionary();
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    for (auto const& iter: efdh.getEmbeddedFiles()) {
        std::string const& key = iter.first;
        auto fsoh = iter.second;
        auto j_details = j_attachments.addDictionaryMember(key, JSON::makeDictionary());
        j_details.addDictionaryMember(
            "filespec", JSON::makeString(fsoh->getObjectHandle().unparse()));
        j_details.addDictionaryMember("preferredname", JSON::makeString(fsoh->getFilename()));
        j_details.addDictionaryMember(
            "preferredcontents", JSON::makeString(fsoh->getEmbeddedFileStream().unparse()));
        j_details.addDictionaryMember("description", null_or_string(fsoh->getDescription()));
        auto j_names = j_details.addDictionaryMember("names", JSON::makeDictionary());
        for (auto const& i2: fsoh->getFilenames()) {
            j_names.addDictionaryMember(i2.first, JSON::makeString(i2.second));
        }
        auto j_streams = j_details.addDictionaryMember("streams", JSON::makeDictionary());
        for (auto const& [key2, value2]: fsoh->getEmbeddedFileStreams().as_dictionary()) {
            if (value2.null()) {
                continue;
            }
            auto efs = QPDFEFStreamObjectHelper(value2);
            auto j_stream = j_streams.addDictionaryMember(key2, JSON::makeDictionary());
            j_stream.addDictionaryMember(
                "creationdate", null_or_string(to_iso8601(efs.getCreationDate())));
            j_stream.addDictionaryMember(
                "modificationdate", null_or_string(to_iso8601(efs.getCreationDate())));
            j_stream.addDictionaryMember("mimetype", null_or_string(efs.getSubtype()));
            j_stream.addDictionaryMember(
                "checksum", null_or_string(QUtil::hex_encode(efs.getChecksum())));
        }
    }
    JSON::writeDictionaryItem(p, first, "attachments", j_attachments, 1);
}